

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O0

vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
vkt::tessellation::anon_unknown_2::genVertexPositions
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           *__return_storage_ptr__,TessPrimitiveType primitiveType)

{
  Vector<float,_2> local_5c;
  Vector<float,_2> local_54;
  Vector<float,_2> local_4c;
  Vector<float,_2> local_44;
  Vector<float,_2> local_3c;
  Vector<float,_2> local_34;
  Vector<float,_2> local_2c [2];
  undefined1 local_15;
  TessPrimitiveType local_14;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *pvStack_10;
  TessPrimitiveType primitiveType_local;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *positions;
  
  local_15 = 0;
  local_14 = primitiveType;
  pvStack_10 = __return_storage_ptr__;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (__return_storage_ptr__);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
            (__return_storage_ptr__,4);
  if (local_14 == TESSPRIMITIVETYPE_TRIANGLES) {
    tcu::Vector<float,_2>::Vector(local_2c,0.8,0.6);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,local_2c);
    tcu::Vector<float,_2>::Vector(&local_34,0.0,-0.786);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_34);
    tcu::Vector<float,_2>::Vector(&local_3c,-0.8,0.6);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_3c);
  }
  else if ((local_14 == TESSPRIMITIVETYPE_QUADS) || (local_14 == TESSPRIMITIVETYPE_ISOLINES)) {
    tcu::Vector<float,_2>::Vector(&local_44,-0.8,-0.8);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_44);
    tcu::Vector<float,_2>::Vector(&local_4c,0.8,-0.8);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_4c);
    tcu::Vector<float,_2>::Vector(&local_54,-0.8,0.8);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_54);
    tcu::Vector<float,_2>::Vector(&local_5c,0.8,0.8);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (__return_storage_ptr__,&local_5c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec2> genVertexPositions (const TessPrimitiveType primitiveType)
{
	std::vector<tcu::Vec2> positions;
	positions.reserve(4);

	if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		positions.push_back(tcu::Vec2( 0.8f,    0.6f));
		positions.push_back(tcu::Vec2( 0.0f, -0.786f));
		positions.push_back(tcu::Vec2(-0.8f,    0.6f));
	}
	else if (primitiveType == TESSPRIMITIVETYPE_QUADS || primitiveType == TESSPRIMITIVETYPE_ISOLINES)
	{
		positions.push_back(tcu::Vec2(-0.8f, -0.8f));
		positions.push_back(tcu::Vec2( 0.8f, -0.8f));
		positions.push_back(tcu::Vec2(-0.8f,  0.8f));
		positions.push_back(tcu::Vec2( 0.8f,  0.8f));
	}
	else
		DE_ASSERT(false);

	return positions;
}